

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O2

void __thiscall tcu::StringTemplate::~StringTemplate(StringTemplate *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

StringTemplate::~StringTemplate (void)
{
}